

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readpsm.c
# Opt level: O3

int pattcmp(uchar *a,uchar *b,size_t l)

{
  int iVar1;
  int iVar2;
  uchar *in_RAX;
  ulong uVar3;
  size_t __n;
  int iVar4;
  size_t sVar5;
  char *p;
  uchar *local_38;
  
  local_38 = in_RAX;
  iVar1 = bcmp(a,b,l);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    if (l == 0) {
      iVar1 = 0;
      __n = 0;
      iVar4 = 0;
    }
    else {
      sVar5 = 0;
      do {
        if ((byte)(a[sVar5] - 0x30) < 10) {
          uVar3 = strtoul((char *)(a + sVar5),(char **)&local_38,10);
          iVar4 = (int)uVar3;
          if (a + sVar5 == local_38) {
            return 1;
          }
          if (l != 0) goto LAB_0070cc38;
          iVar1 = 0;
          __n = 0;
          goto LAB_0070cc8d;
        }
        sVar5 = sVar5 + 1;
      } while (l != sVar5);
      iVar4 = 0;
      sVar5 = l;
LAB_0070cc38:
      __n = 0;
      do {
        if ((byte)(b[__n] - 0x30) < 10) {
          uVar3 = strtoul((char *)(b + __n),(char **)&local_38,10);
          iVar1 = (int)uVar3;
          if (b + __n == local_38) {
            return -1;
          }
          goto LAB_0070cc6e;
        }
        __n = __n + 1;
      } while (l != __n);
      iVar1 = 0;
      __n = l;
LAB_0070cc6e:
      if (sVar5 < __n) {
        return -1;
      }
    }
LAB_0070cc8d:
    iVar2 = memcmp(a,b,__n);
    iVar1 = iVar4 - iVar1;
    if (iVar2 != 0) {
      iVar1 = iVar2;
    }
  }
  return iVar1;
}

Assistant:

int pattcmp( const unsigned char * a, const unsigned char * b, size_t l )
{
	size_t i, j;
	int na = 0, nb = 0, k;
	char * p;

	k = memcmp( a, b, l );
	if ( !k ) return k;

	/* damnit */

	for ( i = 0; i < l; ++i )
	{
		if ( a [i] >= '0' && a [i] <= '9' ) break;
	}

	if ( i < l )
	{
		na = strtoul( (const char *)a + i, &p, 10 );
		if ( p == (const char *)a + i ) return 1;
	}

	for ( j = 0; j < l; ++j )
	{
		if ( b [j] >= '0' && b [j] <= '9' ) break;
	}

	if ( j < l )
	{
		nb = strtoul( (const char *)b + j, &p, 10 );
		if ( p == (const char *)b + j ) return -1;
	}

	if ( i < j ) return -1;
	else if ( j > i ) return 1;

	k = memcmp( a, b, j );
	if ( k ) return k;

	return na - nb;
}